

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O3

void duckdb::DebugVerifyVectorSetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  DebugVectorVerification DVar1;
  string str_input;
  string local_50;
  string local_30;
  
  Value::GetValue<std::__cxx11::string>(&local_30,input);
  StringUtil::Upper(&local_50,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  DVar1 = EnumUtil::FromString<duckdb::DebugVectorVerification>(local_50._M_dataplus._M_p);
  (config->options).debug_verify_vector = DVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DebugVerifyVectorSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto str_input = StringUtil::Upper(input.GetValue<string>());
	config.options.debug_verify_vector = EnumUtil::FromString<DebugVectorVerification>(str_input);
}